

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O2

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeArrayFill(SExpressionWasmBuilder *this,Element *s)

{
  Element *pEVar1;
  HeapType heapType;
  Expression *child;
  Expression *index;
  Expression *value;
  Expression *size;
  ArrayFill *pAVar2;
  SExpressionWasmBuilder *this_00;
  Builder local_38;
  
  pEVar1 = Element::operator[](s,1);
  heapType = parseHeapType(this,pEVar1);
  pEVar1 = Element::operator[](s,2);
  this_00 = this;
  child = parseExpression(this,pEVar1);
  validateHeapTypeUsingChild(this_00,child,heapType,s);
  pEVar1 = Element::operator[](s,3);
  index = parseExpression(this,pEVar1);
  pEVar1 = Element::operator[](s,4);
  value = parseExpression(this,pEVar1);
  pEVar1 = Element::operator[](s,5);
  size = parseExpression(this,pEVar1);
  local_38.wasm = this->wasm;
  pAVar2 = Builder::makeArrayFill(&local_38,child,index,value,size);
  return (Expression *)pAVar2;
}

Assistant:

Expression* SExpressionWasmBuilder::makeArrayFill(Element& s) {
  auto heapType = parseHeapType(*s[1]);
  auto ref = parseExpression(*s[2]);
  validateHeapTypeUsingChild(ref, heapType, s);
  auto index = parseExpression(*s[3]);
  auto value = parseExpression(*s[4]);
  auto size = parseExpression(*s[5]);
  return Builder(wasm).makeArrayFill(ref, index, value, size);
}